

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall
ImGuiListClipper::ForceDisplayRangeByIndices(ImGuiListClipper *this,int item_min,int item_max)

{
  ImVector<ImGuiListClipperRange> *this_00;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ImGuiListClipperData *data;
  ImGuiListClipperRange *in_stack_ffffffffffffffb8;
  
  if (in_ESI < in_EDX) {
    this_00 = (ImVector<ImGuiListClipperRange> *)(*(long *)(in_RDI + 0x18) + 0x18);
    ImGuiListClipperRange::FromIndices(in_ESI,in_EDX);
    ImVector<ImGuiListClipperRange>::push_back(this_00,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void ImGuiListClipper::ForceDisplayRangeByIndices(int item_min, int item_max)
{
    ImGuiListClipperData* data = (ImGuiListClipperData*)TempData;
    IM_ASSERT(DisplayStart < 0); // Only allowed after Begin() and if there has not been a specified range yet.
    IM_ASSERT(item_min <= item_max);
    if (item_min < item_max)
        data->Ranges.push_back(ImGuiListClipperRange::FromIndices(item_min, item_max));
}